

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_false,_false>_>_>
::reset(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_false,_false>_>_>
        *this,Column_settings *colSettings)

{
  pointer puVar1;
  
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_false,_false>_>_>_>_>
  ::_M_erase_at_end(&(this->reducedMatrixR_).matrix_,
                    (this->reducedMatrixR_).matrix_.
                    super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_false,_false>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  (this->reducedMatrixR_).nextInsertIndex_ = 0;
  (this->reducedMatrixR_).colSettings_ = colSettings;
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_false,_false>_>_>_>_>
  ::_M_erase_at_end(&(this->mirrorMatrixU_).matrix_,
                    (this->mirrorMatrixU_).matrix_.
                    super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_false,_false>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  (this->mirrorMatrixU_).nextInsertIndex_ = 0;
  (this->mirrorMatrixU_).colSettings_ = colSettings;
  puVar1 = (this->pivotToColumnIndex_).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->pivotToColumnIndex_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar1) {
    (this->pivotToColumnIndex_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  this->nextEventIndex_ = 0;
  return;
}

Assistant:

void reset(Column_settings* colSettings) {
    reducedMatrixR_.reset(colSettings);
    mirrorMatrixU_.reset(colSettings);
    pivotToColumnIndex_.clear();
    nextEventIndex_ = 0;
    if constexpr (!Master_matrix::Option_list::is_z2) {
      operators_ = &(colSettings->operators);
    }
  }